

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_BLX_i(DisasContext_conflict1 *s,arg_BLX_i *a)

{
  TCGContext_conflict1 *tcg_ctx;
  _Bool _Var1;
  TCGv_i32 var;
  
  tcg_ctx = s->uc->tcg_ctx;
  if ((s->thumb == 0) || ((a->imm & 2) == 0)) {
    tcg_gen_movi_i32(tcg_ctx,tcg_ctx->cpu_R[0xe],s->thumb | (uint)(s->base).pc_next);
    var = tcg_const_i32_aarch64(tcg_ctx,(uint)(s->thumb == 0));
    store_cpu_offset(tcg_ctx,var,0x220);
    gen_jmp(s,((int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4 & 0xfffffffc) + a->imm);
    _Var1 = true;
  }
  else {
    _Var1 = false;
  }
  return _Var1;
}

Assistant:

static bool trans_BLX_i(DisasContext *s, arg_BLX_i *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tmp;

    /* For A32, ARCH(5) is checked near the start of the uncond block. */
    if (s->thumb && (a->imm & 2)) {
        return false;
    }
    tcg_gen_movi_i32(tcg_ctx, tcg_ctx->cpu_R[14], s->base.pc_next | s->thumb);
    tmp = tcg_const_i32(tcg_ctx, !s->thumb);
    store_cpu_field(tcg_ctx, tmp, thumb);
    gen_jmp(s, (read_pc(s) & ~3) + a->imm);
    return true;
}